

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void middle_init(middle_t *middle,void *base_mem,uint8 quant_bits,uint32 entries,uint32 max_vocab,
                uint32 max_next,void *next_source)

{
  uint32 max_next_local;
  uint32 max_vocab_local;
  uint32 entries_local;
  uint8 quant_bits_local;
  void *base_mem_local;
  middle_t *middle_local;
  
  middle->quant_bits = quant_bits;
  bitarr_mask_from_max(&middle->next_mask,max_next);
  middle->next_source = next_source;
  if ((0x1ffffff < entries + 1) || (0x1ffffff < max_next)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x6f,
            "Sorry, this does not support more than %d n-grams of a particular order.  Edit util/bit_packing.hh and fix the bit packing functions\n"
            ,0x2000000);
  }
  base_init(&middle->base,base_mem,max_vocab,quant_bits + (middle->next_mask).bits);
  return;
}

Assistant:

void
middle_init(middle_t * middle, void *base_mem, uint8 quant_bits,
            uint32 entries, uint32 max_vocab, uint32 max_next,
            void *next_source)
{
    middle->quant_bits = quant_bits;
    bitarr_mask_from_max(&middle->next_mask, max_next);
    middle->next_source = next_source;
    if (entries + 1 >= (1U << 25) || (max_next >= (1U << 25)))
        E_ERROR
            ("Sorry, this does not support more than %d n-grams of a particular order.  Edit util/bit_packing.hh and fix the bit packing functions\n",
             (1U << 25));
    base_init(&middle->base, base_mem, max_vocab,
              quant_bits + middle->next_mask.bits);
}